

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ShaderSourceCase::test(ShaderSourceCase *this)

{
  undefined *puVar1;
  int iVar2;
  qpTestResult qVar3;
  int *piVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  CallLogWrapper *pCVar7;
  int local_19f4;
  MessageBuilder local_19f0;
  MessageBuilder local_1870;
  GLsizei local_16ec;
  GLchar local_16e8 [4];
  GLint written_1;
  char buffer_1 [2048];
  MessageBuilder local_d68;
  allocator<char> local_be1;
  string local_be0 [32];
  int local_bc0;
  GLsizei local_bbc;
  GLint referenceLength_2;
  GLint written;
  char buffer [2048];
  MessageBuilder local_3b0;
  allocator<char> local_229;
  string local_228 [32];
  int local_208;
  undefined1 local_204 [4];
  GLint referenceLength_1;
  StateQueryMemoryWriteGuard<int> sourceLength_1;
  char *shaders [2];
  MessageBuilder local_1e0;
  allocator<char> local_49;
  string local_48 [36];
  int local_24;
  undefined1 local_20 [4];
  GLint referenceLength;
  StateQueryMemoryWriteGuard<int> sourceLength;
  GLuint shader;
  ShaderSourceCase *this_local;
  
  pCVar7 = &(this->super_ApiCase).super_CallLogWrapper;
  unique0x10001035 = this;
  requireShaderCompiler
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,pCVar7);
  sourceLength.m_value = glu::CallLogWrapper::glCreateShader(pCVar7,0x8b31);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    pCVar7,sourceLength.m_value,0x8b88,0);
  glu::CallLogWrapper::glShaderSource
            (pCVar7,sourceLength.m_value,1,&(anonymous_namespace)::brokenShader,(GLint *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_20);
  iVar2 = sourceLength.m_value;
  piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_20);
  glu::CallLogWrapper::glGetShaderiv(pCVar7,iVar2,0x8b88,piVar4);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)local_20,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  puVar1 = (anonymous_namespace)::brokenShader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,puVar1,&local_49);
  iVar2 = std::__cxx11::string::length();
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_24 = iVar2 + 1;
  piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                     ((StateQueryMemoryWriteGuard *)local_20);
  if (*piVar4 != local_24) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_1e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [27])"// ERROR: Expected length ")
    ;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_24);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0xad9ec2);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(StateQueryMemoryWriteGuard<int> *)local_20);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    qVar3 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar3 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  sourceLength_1._4_8_ = (anonymous_namespace)::brokenShader;
  pCVar7 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glShaderSource
            (pCVar7,sourceLength.m_value,2,(GLchar **)&sourceLength_1.m_value,(GLint *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_204);
  iVar2 = sourceLength.m_value;
  piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_204);
  glu::CallLogWrapper::glGetShaderiv(pCVar7,iVar2,0x8b88,piVar4);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)local_204,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  puVar1 = (anonymous_namespace)::brokenShader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,puVar1,&local_229);
  iVar2 = std::__cxx11::string::length();
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  local_208 = iVar2 * 2 + 1;
  piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                     ((StateQueryMemoryWriteGuard *)local_204);
  if (*piVar4 != local_208) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_3b0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_3b0,(char (*) [27])"// ERROR: Expected length ")
    ;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_208);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0xad9ec2);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(StateQueryMemoryWriteGuard<int> *)local_204);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3b0);
    qVar3 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar3 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  memset(&referenceLength_2,0,0x800);
  referenceLength_2._0_1_ = 0x78;
  local_bbc = 0;
  glu::CallLogWrapper::glGetShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,sourceLength.m_value,0x800,&local_bbc,
             (GLchar *)&referenceLength_2);
  puVar1 = (anonymous_namespace)::brokenShader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_be0,puVar1,&local_be1);
  iVar2 = std::__cxx11::string::length();
  iVar2 = iVar2 << 1;
  std::__cxx11::string::~string(local_be0);
  std::allocator<char>::~allocator(&local_be1);
  local_bc0 = iVar2;
  if (local_bbc == iVar2) {
    if (*(char *)((long)&referenceLength_2 + (long)iVar2) != '\0') {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)(buffer_1 + 0x7f8),pTVar5,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)(buffer_1 + 0x7f8),
                          (char (*) [39])"// ERROR: Expected null terminator at ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_bc0);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(buffer_1 + 0x7f8));
      qVar3 = tcu::TestContext::getTestResult
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
      if (qVar3 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"did not get a null terminator");
      }
    }
  }
  else {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_d68,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_d68,(char (*) [33])"// ERROR: Expected write length ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_bc0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0xad9ec2);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_bbc);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_d68);
    qVar3 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar3 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  memset(local_16e8,0,0x800);
  local_16e8[0] = 'x';
  local_16ec = 0;
  glu::CallLogWrapper::glGetShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,sourceLength.m_value,1,&local_16ec,
             local_16e8);
  if (local_16ec != 0) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_1870,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1870,(char (*) [40])"// ERROR: Expected write length 0; got ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_16ec);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1870);
    qVar3 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar3 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  if (local_16e8[0] != '\0') {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_19f0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_19f0,(char (*) [41])"// ERROR: Expected null terminator; got=");
    local_19f4 = (int)local_16e8[0];
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_19f4);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])", char=");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_16e8);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_19f0);
    qVar3 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar3 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got invalid terminator");
    }
  }
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ApiCase).super_CallLogWrapper,sourceLength.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		requireShaderCompiler(m_testCtx, *this);

		using tcu::TestLog;

		// SHADER_SOURCE_LENGTH does include 0-terminator
		const GLuint shader = glCreateShader(GL_VERTEX_SHADER);
		verifyShaderParam(m_testCtx, *this, shader, GL_SHADER_SOURCE_LENGTH, 0);

		// check the SHADER_SOURCE_LENGTH
		{
			glShaderSource(shader, 1, &brokenShader, DE_NULL);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLint> sourceLength;
			glGetShaderiv(shader, GL_SHADER_SOURCE_LENGTH, &sourceLength);

			sourceLength.verifyValidity(m_testCtx);

			const GLint referenceLength = (GLint)std::string(brokenShader).length() + 1; // including the null terminator
			if (sourceLength != referenceLength)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected length " << referenceLength	<< "; got " << sourceLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
		}

		// check the concat source SHADER_SOURCE_LENGTH
		{
			const char* shaders[] = {brokenShader, brokenShader};
			glShaderSource(shader, 2, shaders, DE_NULL);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLint> sourceLength;
			glGetShaderiv(shader, GL_SHADER_SOURCE_LENGTH, &sourceLength);

			sourceLength.verifyValidity(m_testCtx);

			const GLint referenceLength = 2 * (GLint)std::string(brokenShader).length() + 1; // including the null terminator
			if (sourceLength != referenceLength)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected length " << referenceLength << "; got " << sourceLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
		}

		// check the string length
		{
			char buffer[2048] = {'x'};
			DE_ASSERT(DE_LENGTH_OF_ARRAY(buffer) > 2 * (int)std::string(brokenShader).length());

			GLint written = 0; // not inluding null-terminator
			glGetShaderSource(shader, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);

			const GLint referenceLength = 2 * (GLint)std::string(brokenShader).length();
			if (written != referenceLength)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length " << referenceLength << "; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
			// check null pointer at
			else
			{
				if (buffer[referenceLength] != '\0')
				{
					m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator at " << referenceLength << TestLog::EndMessage;
					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "did not get a null terminator");
				}
			}
		}

		// check with small buffer
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			glGetShaderSource(shader, 1, &written, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length 0; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
			if (buffer[0] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator; got=" << int(buffer[0]) << ", char=" << buffer[0] << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid terminator");
			}
		}

		glDeleteShader(shader);
		expectError(GL_NO_ERROR);
	}